

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

HelicsFilter
helicsCoreRegisterFilter(HelicsCore core,HelicsFilterTypes type,char *name,HelicsError *err)

{
  Filter *pFVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _Head_base<0UL,_helics::Filter_*,_false> _Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_t sVar5;
  HelicsFilter pvVar6;
  string_view name_00;
  __single_object filt;
  FilterObject *local_80;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_78;
  _Head_base<0UL,_helics::Filter_*,_false> local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  getCoreSharedPtr(&local_68,(HelicsError *)core);
  peVar3 = local_68;
  if (local_68 == (element_type *)0x0) {
    pvVar6 = (HelicsFilter)0x0;
  }
  else {
    local_80 = (FilterObject *)operator_new(0x58);
    (local_80->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_80->buffer)._M_dataplus._M_p = (pointer)0x0;
    (local_80->buffer)._M_string_length = 0;
    (local_80->buffer).field_2._M_allocated_capacity = 0;
    (local_80->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_80->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_80->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    (local_80->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_80->cloning = false;
    local_80->custom = false;
    *(undefined2 *)&local_80->field_0x2 = 0;
    local_80->valid = 0;
    local_80->filtPtr = (Filter *)0x0;
    *(undefined8 *)((long)&(local_80->buffer).field_2 + 8) = 0;
    (local_80->buffer)._M_dataplus._M_p = (pointer)&(local_80->buffer).field_2;
    (local_80->buffer)._M_string_length = 0;
    (local_80->buffer).field_2._M_local_buf[0] = '\0';
    local_50 = local_40;
    if (name == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar5 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar5);
    }
    name_00._M_str = local_48;
    name_00._M_len = (size_t)peVar3;
    helics::make_filter((FilterTypes)&local_70,(Core *)(ulong)type,name_00);
    _Var2._M_head_impl = local_70._M_head_impl;
    local_70._M_head_impl = (Filter *)0x0;
    pFVar1 = (local_80->uFilter)._M_t.
             super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
             super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
             super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    (local_80->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pFVar1 != (Filter *)0x0) {
      (**(code **)((long)(pFVar1->super_Interface)._vptr_Interface + 8))();
    }
    if (local_70._M_head_impl != (Filter *)0x0) {
      (*((local_70._M_head_impl)->super_Interface)._vptr_Interface[1])();
    }
    local_70._M_head_impl = (Filter *)0x0;
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    p_Var4 = p_Stack_60;
    peVar3 = local_68;
    local_80->filtPtr =
         (local_80->uFilter)._M_t.
         super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
         super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
         super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
    local_68 = (element_type *)0x0;
    p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_80->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_80->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
    ;
    (local_80->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    local_80->custom = type == HELICS_FILTER_TYPE_CUSTOM;
    local_78._M_head_impl = local_80;
    local_80 = (FilterObject *)0x0;
    pvVar6 = anon_unknown.dwarf_bbcfa::coreAddFilter
                       (core,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                              *)&local_78);
    if (local_78._M_head_impl != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_78,local_78._M_head_impl);
    }
    local_78._M_head_impl = (FilterObject *)0x0;
    if (local_80 != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_80,local_80);
    }
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  return pvVar6;
}

Assistant:

HelicsFilter helicsCoreRegisterFilter(HelicsCore core, HelicsFilterTypes type, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_filter(static_cast<helics::FilterTypes>(type), corePtr.get(), AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->custom = (type == HELICS_FILTER_TYPE_CUSTOM);
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}